

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsPublicationPublishTime(HelicsPublication pub,HelicsTime val,HelicsError *err)

{
  PublicationObject *pPVar1;
  Time tval;
  PublicationObject *pubObj;
  Publication *in_stack_00000088;
  Time in_stack_00000090;
  double in_stack_ffffffffffffffb8;
  HelicsError *in_stack_ffffffffffffffc0;
  HelicsPublication in_stack_ffffffffffffffc8;
  
  pPVar1 = anon_unknown.dwarf_5d1c2::verifyPublication
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pPVar1 != (PublicationObject *)0x0) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    helics::Publication::publish(in_stack_00000088,in_stack_00000090);
  }
  return;
}

Assistant:

void helicsPublicationPublishTime(HelicsPublication pub, HelicsTime val, HelicsError* err)
{
    auto* pubObj = verifyPublication(pub, err);
    if (pubObj == nullptr) {
        return;
    }
    try {
        const helics::Time tval(val);
        pubObj->pubPtr->publish(tval);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}